

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  AssignmentPatternExpressionSyntax *pAVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  SyntaxNode *local_20;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_20 = (SyntaxNode *)0x0;
  }
  else {
    local_20 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  }
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::DataTypeSyntax*,slang::syntax::AssignmentPatternSyntax&>
                     ((BumpAllocator *)__child_stack,(DataTypeSyntax **)&local_20,
                      (AssignmentPatternSyntax *)args_1);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AssignmentPatternExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AssignmentPatternExpressionSyntax>(
        node.type ? deepClone(*node.type, alloc) : nullptr,
        *deepClone<AssignmentPatternSyntax>(*node.pattern, alloc)
    );
}